

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_checkupvalcolor(global_State *g,UpVal *uv)

{
  GCObject *o;
  UpVal *uv_local;
  global_State *g_local;
  
  if ((uv->marked & 7) == 0) {
    if ((g->gckind == '\x02') || (g->gcstate < 2)) {
      uv->marked = uv->marked & 0xbf;
      uv->marked = uv->marked | 4;
      if (((uv->v->tt_ & 0x40U) != 0) && (((byte)(uv->v->value_).f[9] & 3) != 0)) {
        reallymarkobject(g,(uv->v->value_).gc);
      }
    }
    else {
      uv->marked = uv->marked & 0xb8 | g->currentwhite & 3;
    }
  }
  return;
}

Assistant:

void luaC_checkupvalcolor (global_State *g, UpVal *uv) {
  GCObject *o = obj2gco(uv);
  lua_assert(!isblack(o));  /* open upvalues are never black */
  if (isgray(o)) {
    if (keepinvariant(g)) {
      resetoldbit(o);  /* see MOVE OLD rule */
      gray2black(o);  /* it is being visited now */
      markvalue(g, uv->v);
    }
    else {
      lua_assert(issweepphase(g));
      makewhite(g, o);
    }
  }
}